

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void warp_horizontal_filter_alpha0_beta0_avx2
               (uint8_t *ref,__m256i *horz_out,int stride,int32_t ix4,int32_t iy4,int32_t sx4,
               int alpha,int beta,int p_height,int height,int i,__m256i *round_const,__m128i *shift,
               __m256i *shuffle_src)

{
  undefined8 uVar1;
  __m256i src;
  __m256i src_00;
  int iVar2;
  int in_ECX;
  int in_EDX;
  longlong unaff_RBP;
  long in_RDI;
  int in_R8D;
  undefined1 in_stack_00000000 [16];
  undefined4 in_stack_00000014;
  __m128i src1;
  __m128i src0;
  __m256i coeff [4];
  int row;
  int iy;
  int k;
  undefined4 local_188;
  __m256i *in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffea0 [32];
  undefined4 local_8c;
  int in_stack_ffffffffffffffcc;
  __m128i *in_stack_ffffffffffffffd0;
  __m256i *in_stack_ffffffffffffffd8;
  __m256i *in_stack_ffffffffffffffe0;
  __m256i *in_stack_ffffffffffffffe8;
  __m256i *in_stack_fffffffffffffff0;
  
  prepare_horizontal_filter_coeff_alpha0_avx2
            (in_stack_fffffffffffffea0._4_4_,in_stack_fffffffffffffea0._0_4_,
             in_stack_fffffffffffffe98);
  local_8c = -7;
  while( true ) {
    if (beta - height < 9) {
      local_188 = beta - height;
    }
    else {
      local_188 = 8;
    }
    if (local_188 + -2 < local_8c) break;
    iVar2 = clamp(in_R8D + local_8c,0,p_height + -1);
    uVar1 = *(undefined8 *)((long)in_ECX + in_RDI + iVar2 * in_EDX + 1);
    clamp(in_R8D + 1 + local_8c,0,p_height + -1);
    in_stack_ffffffffffffffcc = (int)((ulong)uVar1 >> 0x20);
    src[3]._0_4_ = alpha;
    src._8_16_ = in_stack_00000000;
    src[3]._4_4_ = in_stack_00000014;
    src[0] = unaff_RBP;
    filter_src_pixels_avx2
              (src,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
               in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    local_8c = local_8c + 2;
  }
  clamp(in_R8D + local_8c,0,p_height + -1);
  src_00[3]._0_4_ = alpha;
  src_00._8_16_ = in_stack_00000000;
  src_00[3]._4_4_ = in_stack_00000014;
  src_00[0] = unaff_RBP;
  filter_src_pixels_avx2
            (src_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

static inline void warp_horizontal_filter_alpha0_beta0_avx2(
    const uint8_t *ref, __m256i *horz_out, int stride, int32_t ix4, int32_t iy4,
    int32_t sx4, int alpha, int beta, int p_height, int height, int i,
    const __m256i *round_const, const __m128i *shift,
    const __m256i *shuffle_src) {
  (void)alpha;
  int k, iy, row = 0;
  __m256i coeff[4];
  prepare_horizontal_filter_coeff_alpha0_avx2(beta, sx4, coeff);
  for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
    iy = iy4 + k;
    iy = clamp(iy, 0, height - 1);
    const __m128i src0 =
        _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
    iy = iy4 + k + 1;
    iy = clamp(iy, 0, height - 1);
    const __m128i src1 =
        _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
    const __m256i src_01 =
        _mm256_inserti128_si256(_mm256_castsi128_si256(src0), src1, 0x1);
    filter_src_pixels_avx2(src_01, horz_out, coeff, shuffle_src, round_const,
                           shift, row);
    row += 1;
  }
  iy = iy4 + k;
  iy = clamp(iy, 0, height - 1);
  const __m256i src_01 = _mm256_castsi128_si256(
      _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7)));
  filter_src_pixels_avx2(src_01, horz_out, coeff, shuffle_src, round_const,
                         shift, row);
}